

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__vertical_scatter_with_6_coeffs
               (float **outputs,float *vertical_coefficients,float *input,float *input_end)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float r;
  __m128 r0_1;
  __m128 o0_1;
  __m128 r3;
  __m128 r2;
  __m128 r1;
  __m128 r0;
  __m128 o3;
  __m128 o2;
  __m128 o1;
  __m128 o0;
  __m128 c5;
  __m128 c4;
  __m128 c3;
  __m128 c2;
  __m128 c1;
  __m128 c0;
  float *pfStack_908;
  float c5s;
  float *output5;
  float *pfStack_8f8;
  float c4s;
  float *output4;
  float *pfStack_8e8;
  float c3s;
  float *output3;
  float *pfStack_8d8;
  float c2s;
  float *output2;
  float *pfStack_8c8;
  float c1s;
  float *output1;
  float *pfStack_8b8;
  float c0s;
  float *output0;
  float *input_end_local;
  float *input_local;
  float *vertical_coefficients_local;
  float **outputs_local;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  
  pfStack_8b8 = *outputs;
  fVar1 = *vertical_coefficients;
  pfStack_8c8 = outputs[1];
  fVar2 = vertical_coefficients[1];
  pfStack_8d8 = outputs[2];
  fVar3 = vertical_coefficients[2];
  pfStack_8e8 = outputs[3];
  fVar4 = vertical_coefficients[3];
  pfStack_8f8 = outputs[4];
  fVar5 = vertical_coefficients[4];
  pfStack_908 = outputs[5];
  fVar6 = vertical_coefficients[5];
  for (input_end_local = input; 0x3f < (long)input_end - (long)input_end_local;
      input_end_local = input_end_local + 0x10) {
    local_f8 = (float)*(undefined8 *)input_end_local;
    fStack_f4 = (float)((ulong)*(undefined8 *)input_end_local >> 0x20);
    fStack_f0 = (float)*(undefined8 *)(input_end_local + 2);
    fStack_ec = (float)((ulong)*(undefined8 *)(input_end_local + 2) >> 0x20);
    local_118 = (float)*(undefined8 *)(input_end_local + 4);
    fStack_114 = (float)((ulong)*(undefined8 *)(input_end_local + 4) >> 0x20);
    fStack_110 = (float)*(undefined8 *)(input_end_local + 6);
    fStack_10c = (float)((ulong)*(undefined8 *)(input_end_local + 6) >> 0x20);
    local_138 = (float)*(undefined8 *)(input_end_local + 8);
    fStack_134 = (float)((ulong)*(undefined8 *)(input_end_local + 8) >> 0x20);
    fStack_130 = (float)*(undefined8 *)(input_end_local + 10);
    fStack_12c = (float)((ulong)*(undefined8 *)(input_end_local + 10) >> 0x20);
    local_158 = (float)*(undefined8 *)(input_end_local + 0xc);
    fStack_154 = (float)((ulong)*(undefined8 *)(input_end_local + 0xc) >> 0x20);
    fStack_150 = (float)*(undefined8 *)(input_end_local + 0xe);
    fStack_14c = (float)((ulong)*(undefined8 *)(input_end_local + 0xe) >> 0x20);
    *(ulong *)pfStack_8b8 = CONCAT44(fStack_f4 * fVar1,local_f8 * fVar1);
    *(ulong *)(pfStack_8b8 + 2) = CONCAT44(fStack_ec * fVar1,fStack_f0 * fVar1);
    *(ulong *)(pfStack_8b8 + 4) = CONCAT44(fStack_114 * fVar1,local_118 * fVar1);
    *(ulong *)(pfStack_8b8 + 6) = CONCAT44(fStack_10c * fVar1,fStack_110 * fVar1);
    *(ulong *)(pfStack_8b8 + 8) = CONCAT44(fStack_134 * fVar1,local_138 * fVar1);
    *(ulong *)(pfStack_8b8 + 10) = CONCAT44(fStack_12c * fVar1,fStack_130 * fVar1);
    *(ulong *)(pfStack_8b8 + 0xc) = CONCAT44(fStack_154 * fVar1,local_158 * fVar1);
    *(ulong *)(pfStack_8b8 + 0xe) = CONCAT44(fStack_14c * fVar1,fStack_150 * fVar1);
    *(ulong *)pfStack_8c8 = CONCAT44(fStack_f4 * fVar2,local_f8 * fVar2);
    *(ulong *)(pfStack_8c8 + 2) = CONCAT44(fStack_ec * fVar2,fStack_f0 * fVar2);
    *(ulong *)(pfStack_8c8 + 4) = CONCAT44(fStack_114 * fVar2,local_118 * fVar2);
    *(ulong *)(pfStack_8c8 + 6) = CONCAT44(fStack_10c * fVar2,fStack_110 * fVar2);
    *(ulong *)(pfStack_8c8 + 8) = CONCAT44(fStack_134 * fVar2,local_138 * fVar2);
    *(ulong *)(pfStack_8c8 + 10) = CONCAT44(fStack_12c * fVar2,fStack_130 * fVar2);
    *(ulong *)(pfStack_8c8 + 0xc) = CONCAT44(fStack_154 * fVar2,local_158 * fVar2);
    *(ulong *)(pfStack_8c8 + 0xe) = CONCAT44(fStack_14c * fVar2,fStack_150 * fVar2);
    *(ulong *)pfStack_8d8 = CONCAT44(fStack_f4 * fVar3,local_f8 * fVar3);
    *(ulong *)(pfStack_8d8 + 2) = CONCAT44(fStack_ec * fVar3,fStack_f0 * fVar3);
    *(ulong *)(pfStack_8d8 + 4) = CONCAT44(fStack_114 * fVar3,local_118 * fVar3);
    *(ulong *)(pfStack_8d8 + 6) = CONCAT44(fStack_10c * fVar3,fStack_110 * fVar3);
    *(ulong *)(pfStack_8d8 + 8) = CONCAT44(fStack_134 * fVar3,local_138 * fVar3);
    *(ulong *)(pfStack_8d8 + 10) = CONCAT44(fStack_12c * fVar3,fStack_130 * fVar3);
    *(ulong *)(pfStack_8d8 + 0xc) = CONCAT44(fStack_154 * fVar3,local_158 * fVar3);
    *(ulong *)(pfStack_8d8 + 0xe) = CONCAT44(fStack_14c * fVar3,fStack_150 * fVar3);
    *(ulong *)pfStack_8e8 = CONCAT44(fStack_f4 * fVar4,local_f8 * fVar4);
    *(ulong *)(pfStack_8e8 + 2) = CONCAT44(fStack_ec * fVar4,fStack_f0 * fVar4);
    *(ulong *)(pfStack_8e8 + 4) = CONCAT44(fStack_114 * fVar4,local_118 * fVar4);
    *(ulong *)(pfStack_8e8 + 6) = CONCAT44(fStack_10c * fVar4,fStack_110 * fVar4);
    *(ulong *)(pfStack_8e8 + 8) = CONCAT44(fStack_134 * fVar4,local_138 * fVar4);
    *(ulong *)(pfStack_8e8 + 10) = CONCAT44(fStack_12c * fVar4,fStack_130 * fVar4);
    *(ulong *)(pfStack_8e8 + 0xc) = CONCAT44(fStack_154 * fVar4,local_158 * fVar4);
    *(ulong *)(pfStack_8e8 + 0xe) = CONCAT44(fStack_14c * fVar4,fStack_150 * fVar4);
    *(ulong *)pfStack_8f8 = CONCAT44(fStack_f4 * fVar5,local_f8 * fVar5);
    *(ulong *)(pfStack_8f8 + 2) = CONCAT44(fStack_ec * fVar5,fStack_f0 * fVar5);
    *(ulong *)(pfStack_8f8 + 4) = CONCAT44(fStack_114 * fVar5,local_118 * fVar5);
    *(ulong *)(pfStack_8f8 + 6) = CONCAT44(fStack_10c * fVar5,fStack_110 * fVar5);
    *(ulong *)(pfStack_8f8 + 8) = CONCAT44(fStack_134 * fVar5,local_138 * fVar5);
    *(ulong *)(pfStack_8f8 + 10) = CONCAT44(fStack_12c * fVar5,fStack_130 * fVar5);
    *(ulong *)(pfStack_8f8 + 0xc) = CONCAT44(fStack_154 * fVar5,local_158 * fVar5);
    *(ulong *)(pfStack_8f8 + 0xe) = CONCAT44(fStack_14c * fVar5,fStack_150 * fVar5);
    *(ulong *)pfStack_908 = CONCAT44(fStack_f4 * fVar6,local_f8 * fVar6);
    *(ulong *)(pfStack_908 + 2) = CONCAT44(fStack_ec * fVar6,fStack_f0 * fVar6);
    *(ulong *)(pfStack_908 + 4) = CONCAT44(fStack_114 * fVar6,local_118 * fVar6);
    *(ulong *)(pfStack_908 + 6) = CONCAT44(fStack_10c * fVar6,fStack_110 * fVar6);
    *(ulong *)(pfStack_908 + 8) = CONCAT44(fStack_134 * fVar6,local_138 * fVar6);
    *(ulong *)(pfStack_908 + 10) = CONCAT44(fStack_12c * fVar6,fStack_130 * fVar6);
    *(ulong *)(pfStack_908 + 0xc) = CONCAT44(fStack_154 * fVar6,local_158 * fVar6);
    *(ulong *)(pfStack_908 + 0xe) = CONCAT44(fStack_14c * fVar6,fStack_150 * fVar6);
    pfStack_8b8 = pfStack_8b8 + 0x10;
    pfStack_8c8 = pfStack_8c8 + 0x10;
    pfStack_8d8 = pfStack_8d8 + 0x10;
    pfStack_8e8 = pfStack_8e8 + 0x10;
    pfStack_8f8 = pfStack_8f8 + 0x10;
    pfStack_908 = pfStack_908 + 0x10;
  }
  for (; 0xf < (long)input_end - (long)input_end_local; input_end_local = input_end_local + 4) {
    local_3f8 = (float)*(undefined8 *)input_end_local;
    fStack_3f4 = (float)((ulong)*(undefined8 *)input_end_local >> 0x20);
    fStack_3f0 = (float)*(undefined8 *)(input_end_local + 2);
    fStack_3ec = (float)((ulong)*(undefined8 *)(input_end_local + 2) >> 0x20);
    *(ulong *)pfStack_8b8 = CONCAT44(fStack_3f4 * fVar1,local_3f8 * fVar1);
    *(ulong *)(pfStack_8b8 + 2) = CONCAT44(fStack_3ec * fVar1,fStack_3f0 * fVar1);
    *(ulong *)pfStack_8c8 = CONCAT44(fStack_3f4 * fVar2,local_3f8 * fVar2);
    *(ulong *)(pfStack_8c8 + 2) = CONCAT44(fStack_3ec * fVar2,fStack_3f0 * fVar2);
    *(ulong *)pfStack_8d8 = CONCAT44(fStack_3f4 * fVar3,local_3f8 * fVar3);
    *(ulong *)(pfStack_8d8 + 2) = CONCAT44(fStack_3ec * fVar3,fStack_3f0 * fVar3);
    *(ulong *)pfStack_8e8 = CONCAT44(fStack_3f4 * fVar4,local_3f8 * fVar4);
    *(ulong *)(pfStack_8e8 + 2) = CONCAT44(fStack_3ec * fVar4,fStack_3f0 * fVar4);
    *(ulong *)pfStack_8f8 = CONCAT44(fStack_3f4 * fVar5,local_3f8 * fVar5);
    *(ulong *)(pfStack_8f8 + 2) = CONCAT44(fStack_3ec * fVar5,fStack_3f0 * fVar5);
    *(ulong *)pfStack_908 = CONCAT44(fStack_3f4 * fVar6,local_3f8 * fVar6);
    *(ulong *)(pfStack_908 + 2) = CONCAT44(fStack_3ec * fVar6,fStack_3f0 * fVar6);
    pfStack_8b8 = pfStack_8b8 + 4;
    pfStack_8c8 = pfStack_8c8 + 4;
    pfStack_8d8 = pfStack_8d8 + 4;
    pfStack_8e8 = pfStack_8e8 + 4;
    pfStack_8f8 = pfStack_8f8 + 4;
    pfStack_908 = pfStack_908 + 4;
  }
  for (; input_end_local < input_end; input_end_local = input_end_local + 1) {
    fVar7 = *input_end_local;
    *pfStack_8b8 = fVar7 * fVar1;
    *pfStack_8c8 = fVar7 * fVar2;
    *pfStack_8d8 = fVar7 * fVar3;
    *pfStack_8e8 = fVar7 * fVar4;
    *pfStack_8f8 = fVar7 * fVar5;
    *pfStack_908 = fVar7 * fVar6;
    pfStack_8b8 = pfStack_8b8 + 1;
    pfStack_8c8 = pfStack_8c8 + 1;
    pfStack_8d8 = pfStack_8d8 + 1;
    pfStack_8e8 = pfStack_8e8 + 1;
    pfStack_8f8 = pfStack_8f8 + 1;
    pfStack_908 = pfStack_908 + 1;
  }
  return;
}

Assistant:

static void STBIR_chans( stbir__vertical_scatter_with_,_coeffs)( float ** outputs, float const * vertical_coefficients, float const * input, float const * input_end )
{
  stbIF0( float STBIR_SIMD_STREAMOUT_PTR( * ) output0 = outputs[0]; float c0s = vertical_coefficients[0]; )
  stbIF1( float STBIR_SIMD_STREAMOUT_PTR( * ) output1 = outputs[1]; float c1s = vertical_coefficients[1]; )
  stbIF2( float STBIR_SIMD_STREAMOUT_PTR( * ) output2 = outputs[2]; float c2s = vertical_coefficients[2]; )
  stbIF3( float STBIR_SIMD_STREAMOUT_PTR( * ) output3 = outputs[3]; float c3s = vertical_coefficients[3]; )
  stbIF4( float STBIR_SIMD_STREAMOUT_PTR( * ) output4 = outputs[4]; float c4s = vertical_coefficients[4]; )
  stbIF5( float STBIR_SIMD_STREAMOUT_PTR( * ) output5 = outputs[5]; float c5s = vertical_coefficients[5]; )
  stbIF6( float STBIR_SIMD_STREAMOUT_PTR( * ) output6 = outputs[6]; float c6s = vertical_coefficients[6]; )
  stbIF7( float STBIR_SIMD_STREAMOUT_PTR( * ) output7 = outputs[7]; float c7s = vertical_coefficients[7]; )

  #ifdef STBIR_SIMD
  {
    stbIF0(stbir__simdfX c0 = stbir__simdf_frepX( c0s ); )
    stbIF1(stbir__simdfX c1 = stbir__simdf_frepX( c1s ); )
    stbIF2(stbir__simdfX c2 = stbir__simdf_frepX( c2s ); )
    stbIF3(stbir__simdfX c3 = stbir__simdf_frepX( c3s ); )
    stbIF4(stbir__simdfX c4 = stbir__simdf_frepX( c4s ); )
    stbIF5(stbir__simdfX c5 = stbir__simdf_frepX( c5s ); )
    stbIF6(stbir__simdfX c6 = stbir__simdf_frepX( c6s ); )
    stbIF7(stbir__simdfX c7 = stbir__simdf_frepX( c7s ); )
    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input_end - (char*) input ) >= (16*stbir__simdfX_float_count) )
    {
      stbir__simdfX o0, o1, o2, o3, r0, r1, r2, r3;
      STBIR_SIMD_NO_UNROLL(output0);

      stbir__simdfX_load( r0, input );               stbir__simdfX_load( r1, input+stbir__simdfX_float_count );     stbir__simdfX_load( r2, input+(2*stbir__simdfX_float_count) );      stbir__simdfX_load( r3, input+(3*stbir__simdfX_float_count) );

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdfX_load( o0, output0 );     stbir__simdfX_load( o1, output0+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output0+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c0 );  stbir__simdfX_madd( o1, o1, r1, c0 );  stbir__simdfX_madd( o2, o2, r2, c0 );   stbir__simdfX_madd( o3, o3, r3, c0 );
              stbir__simdfX_store( output0, o0 );    stbir__simdfX_store( output0+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output0+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output0+(3*stbir__simdfX_float_count), o3 ); )
      stbIF1( stbir__simdfX_load( o0, output1 );     stbir__simdfX_load( o1, output1+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output1+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output1+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c1 );  stbir__simdfX_madd( o1, o1, r1, c1 );  stbir__simdfX_madd( o2, o2, r2, c1 );   stbir__simdfX_madd( o3, o3, r3, c1 );
              stbir__simdfX_store( output1, o0 );    stbir__simdfX_store( output1+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output1+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output1+(3*stbir__simdfX_float_count), o3 ); )
      stbIF2( stbir__simdfX_load( o0, output2 );     stbir__simdfX_load( o1, output2+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output2+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output2+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c2 );  stbir__simdfX_madd( o1, o1, r1, c2 );  stbir__simdfX_madd( o2, o2, r2, c2 );   stbir__simdfX_madd( o3, o3, r3, c2 );
              stbir__simdfX_store( output2, o0 );    stbir__simdfX_store( output2+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output2+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output2+(3*stbir__simdfX_float_count), o3 ); )
      stbIF3( stbir__simdfX_load( o0, output3 );     stbir__simdfX_load( o1, output3+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output3+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output3+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c3 );  stbir__simdfX_madd( o1, o1, r1, c3 );  stbir__simdfX_madd( o2, o2, r2, c3 );   stbir__simdfX_madd( o3, o3, r3, c3 );
              stbir__simdfX_store( output3, o0 );    stbir__simdfX_store( output3+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output3+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output3+(3*stbir__simdfX_float_count), o3 ); )
      stbIF4( stbir__simdfX_load( o0, output4 );     stbir__simdfX_load( o1, output4+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output4+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output4+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c4 );  stbir__simdfX_madd( o1, o1, r1, c4 );  stbir__simdfX_madd( o2, o2, r2, c4 );   stbir__simdfX_madd( o3, o3, r3, c4 );
              stbir__simdfX_store( output4, o0 );    stbir__simdfX_store( output4+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output4+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output4+(3*stbir__simdfX_float_count), o3 ); )
      stbIF5( stbir__simdfX_load( o0, output5 );     stbir__simdfX_load( o1, output5+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output5+(2*stbir__simdfX_float_count));    stbir__simdfX_load( o3, output5+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c5 );  stbir__simdfX_madd( o1, o1, r1, c5 );  stbir__simdfX_madd( o2, o2, r2, c5 );   stbir__simdfX_madd( o3, o3, r3, c5 );
              stbir__simdfX_store( output5, o0 );    stbir__simdfX_store( output5+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output5+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output5+(3*stbir__simdfX_float_count), o3 ); )
      stbIF6( stbir__simdfX_load( o0, output6 );     stbir__simdfX_load( o1, output6+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output6+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output6+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c6 );  stbir__simdfX_madd( o1, o1, r1, c6 );  stbir__simdfX_madd( o2, o2, r2, c6 );   stbir__simdfX_madd( o3, o3, r3, c6 );
              stbir__simdfX_store( output6, o0 );    stbir__simdfX_store( output6+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output6+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output6+(3*stbir__simdfX_float_count), o3 ); )
      stbIF7( stbir__simdfX_load( o0, output7 );     stbir__simdfX_load( o1, output7+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output7+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output7+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c7 );  stbir__simdfX_madd( o1, o1, r1, c7 );  stbir__simdfX_madd( o2, o2, r2, c7 );   stbir__simdfX_madd( o3, o3, r3, c7 );
              stbir__simdfX_store( output7, o0 );    stbir__simdfX_store( output7+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output7+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output7+(3*stbir__simdfX_float_count), o3 ); )
      #else
      stbIF0( stbir__simdfX_mult( o0, r0, c0 );      stbir__simdfX_mult( o1, r1, c0 );      stbir__simdfX_mult( o2, r2, c0 );       stbir__simdfX_mult( o3, r3, c0 );
              stbir__simdfX_store( output0, o0 );    stbir__simdfX_store( output0+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output0+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output0+(3*stbir__simdfX_float_count), o3 ); )
      stbIF1( stbir__simdfX_mult( o0, r0, c1 );      stbir__simdfX_mult( o1, r1, c1 );      stbir__simdfX_mult( o2, r2, c1 );       stbir__simdfX_mult( o3, r3, c1 );
              stbir__simdfX_store( output1, o0 );    stbir__simdfX_store( output1+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output1+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output1+(3*stbir__simdfX_float_count), o3 ); )
      stbIF2( stbir__simdfX_mult( o0, r0, c2 );      stbir__simdfX_mult( o1, r1, c2 );      stbir__simdfX_mult( o2, r2, c2 );       stbir__simdfX_mult( o3, r3, c2 );
              stbir__simdfX_store( output2, o0 );    stbir__simdfX_store( output2+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output2+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output2+(3*stbir__simdfX_float_count), o3 ); )
      stbIF3( stbir__simdfX_mult( o0, r0, c3 );      stbir__simdfX_mult( o1, r1, c3 );      stbir__simdfX_mult( o2, r2, c3 );       stbir__simdfX_mult( o3, r3, c3 );
              stbir__simdfX_store( output3, o0 );    stbir__simdfX_store( output3+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output3+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output3+(3*stbir__simdfX_float_count), o3 ); )
      stbIF4( stbir__simdfX_mult( o0, r0, c4 );      stbir__simdfX_mult( o1, r1, c4 );      stbir__simdfX_mult( o2, r2, c4 );       stbir__simdfX_mult( o3, r3, c4 );
              stbir__simdfX_store( output4, o0 );    stbir__simdfX_store( output4+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output4+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output4+(3*stbir__simdfX_float_count), o3 ); )
      stbIF5( stbir__simdfX_mult( o0, r0, c5 );      stbir__simdfX_mult( o1, r1, c5 );      stbir__simdfX_mult( o2, r2, c5 );       stbir__simdfX_mult( o3, r3, c5 );
              stbir__simdfX_store( output5, o0 );    stbir__simdfX_store( output5+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output5+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output5+(3*stbir__simdfX_float_count), o3 ); )
      stbIF6( stbir__simdfX_mult( o0, r0, c6 );      stbir__simdfX_mult( o1, r1, c6 );      stbir__simdfX_mult( o2, r2, c6 );       stbir__simdfX_mult( o3, r3, c6 );
              stbir__simdfX_store( output6, o0 );    stbir__simdfX_store( output6+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output6+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output6+(3*stbir__simdfX_float_count), o3 ); )
      stbIF7( stbir__simdfX_mult( o0, r0, c7 );      stbir__simdfX_mult( o1, r1, c7 );      stbir__simdfX_mult( o2, r2, c7 );       stbir__simdfX_mult( o3, r3, c7 );
              stbir__simdfX_store( output7, o0 );    stbir__simdfX_store( output7+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output7+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output7+(3*stbir__simdfX_float_count), o3 ); )
      #endif

      input += (4*stbir__simdfX_float_count);
      stbIF0( output0 += (4*stbir__simdfX_float_count); ) stbIF1( output1 += (4*stbir__simdfX_float_count); ) stbIF2( output2 += (4*stbir__simdfX_float_count); ) stbIF3( output3 += (4*stbir__simdfX_float_count); ) stbIF4( output4 += (4*stbir__simdfX_float_count); ) stbIF5( output5 += (4*stbir__simdfX_float_count); ) stbIF6( output6 += (4*stbir__simdfX_float_count); ) stbIF7( output7 += (4*stbir__simdfX_float_count); )
    }
    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input_end - (char*) input ) >= 16 )
    {
      stbir__simdf o0, r0;
      STBIR_SIMD_NO_UNROLL(output0);

      stbir__simdf_load( r0, input );

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdf_load( o0, output0 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) );  stbir__simdf_store( output0, o0 ); )
      stbIF1( stbir__simdf_load( o0, output1 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) );  stbir__simdf_store( output1, o0 ); )
      stbIF2( stbir__simdf_load( o0, output2 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) );  stbir__simdf_store( output2, o0 ); )
      stbIF3( stbir__simdf_load( o0, output3 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) );  stbir__simdf_store( output3, o0 ); )
      stbIF4( stbir__simdf_load( o0, output4 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) );  stbir__simdf_store( output4, o0 ); )
      stbIF5( stbir__simdf_load( o0, output5 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) );  stbir__simdf_store( output5, o0 ); )
      stbIF6( stbir__simdf_load( o0, output6 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) );  stbir__simdf_store( output6, o0 ); )
      stbIF7( stbir__simdf_load( o0, output7 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) );  stbir__simdf_store( output7, o0 ); )
      #else
      stbIF0( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) );   stbir__simdf_store( output0, o0 ); )
      stbIF1( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) );   stbir__simdf_store( output1, o0 ); )
      stbIF2( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) );   stbir__simdf_store( output2, o0 ); )
      stbIF3( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) );   stbir__simdf_store( output3, o0 ); )
      stbIF4( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) );   stbir__simdf_store( output4, o0 ); )
      stbIF5( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) );   stbir__simdf_store( output5, o0 ); )
      stbIF6( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) );   stbir__simdf_store( output6, o0 ); )
      stbIF7( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) );   stbir__simdf_store( output7, o0 ); )
      #endif

      input += 4;
      stbIF0( output0 += 4; ) stbIF1( output1 += 4; ) stbIF2( output2 += 4; ) stbIF3( output3 += 4; ) stbIF4( output4 += 4; ) stbIF5( output5 += 4; ) stbIF6( output6 += 4; ) stbIF7( output7 += 4; )
    }
  }
  #else
  STBIR_NO_UNROLL_LOOP_START
  while ( ( (char*)input_end - (char*) input ) >= 16 )
  {
    float r0, r1, r2, r3;
    STBIR_NO_UNROLL(input);

    r0 = input[0], r1 = input[1], r2 = input[2], r3 = input[3];

    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( output0[0] += ( r0 * c0s ); output0[1] += ( r1 * c0s ); output0[2] += ( r2 * c0s ); output0[3] += ( r3 * c0s ); )
    stbIF1( output1[0] += ( r0 * c1s ); output1[1] += ( r1 * c1s ); output1[2] += ( r2 * c1s ); output1[3] += ( r3 * c1s ); )
    stbIF2( output2[0] += ( r0 * c2s ); output2[1] += ( r1 * c2s ); output2[2] += ( r2 * c2s ); output2[3] += ( r3 * c2s ); )
    stbIF3( output3[0] += ( r0 * c3s ); output3[1] += ( r1 * c3s ); output3[2] += ( r2 * c3s ); output3[3] += ( r3 * c3s ); )
    stbIF4( output4[0] += ( r0 * c4s ); output4[1] += ( r1 * c4s ); output4[2] += ( r2 * c4s ); output4[3] += ( r3 * c4s ); )
    stbIF5( output5[0] += ( r0 * c5s ); output5[1] += ( r1 * c5s ); output5[2] += ( r2 * c5s ); output5[3] += ( r3 * c5s ); )
    stbIF6( output6[0] += ( r0 * c6s ); output6[1] += ( r1 * c6s ); output6[2] += ( r2 * c6s ); output6[3] += ( r3 * c6s ); )
    stbIF7( output7[0] += ( r0 * c7s ); output7[1] += ( r1 * c7s ); output7[2] += ( r2 * c7s ); output7[3] += ( r3 * c7s ); )
    #else
    stbIF0( output0[0]  = ( r0 * c0s ); output0[1]  = ( r1 * c0s ); output0[2]  = ( r2 * c0s ); output0[3]  = ( r3 * c0s ); )
    stbIF1( output1[0]  = ( r0 * c1s ); output1[1]  = ( r1 * c1s ); output1[2]  = ( r2 * c1s ); output1[3]  = ( r3 * c1s ); )
    stbIF2( output2[0]  = ( r0 * c2s ); output2[1]  = ( r1 * c2s ); output2[2]  = ( r2 * c2s ); output2[3]  = ( r3 * c2s ); )
    stbIF3( output3[0]  = ( r0 * c3s ); output3[1]  = ( r1 * c3s ); output3[2]  = ( r2 * c3s ); output3[3]  = ( r3 * c3s ); )
    stbIF4( output4[0]  = ( r0 * c4s ); output4[1]  = ( r1 * c4s ); output4[2]  = ( r2 * c4s ); output4[3]  = ( r3 * c4s ); )
    stbIF5( output5[0]  = ( r0 * c5s ); output5[1]  = ( r1 * c5s ); output5[2]  = ( r2 * c5s ); output5[3]  = ( r3 * c5s ); )
    stbIF6( output6[0]  = ( r0 * c6s ); output6[1]  = ( r1 * c6s ); output6[2]  = ( r2 * c6s ); output6[3]  = ( r3 * c6s ); )
    stbIF7( output7[0]  = ( r0 * c7s ); output7[1]  = ( r1 * c7s ); output7[2]  = ( r2 * c7s ); output7[3]  = ( r3 * c7s ); )
    #endif

    input += 4;
    stbIF0( output0 += 4; ) stbIF1( output1 += 4; ) stbIF2( output2 += 4; ) stbIF3( output3 += 4; ) stbIF4( output4 += 4; ) stbIF5( output5 += 4; ) stbIF6( output6 += 4; ) stbIF7( output7 += 4; )
  }
  #endif
  STBIR_NO_UNROLL_LOOP_START
  while ( input < input_end )
  {
    float r = input[0];
    STBIR_NO_UNROLL(output0);

    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( output0[0] += ( r * c0s ); )
    stbIF1( output1[0] += ( r * c1s ); )
    stbIF2( output2[0] += ( r * c2s ); )
    stbIF3( output3[0] += ( r * c3s ); )
    stbIF4( output4[0] += ( r * c4s ); )
    stbIF5( output5[0] += ( r * c5s ); )
    stbIF6( output6[0] += ( r * c6s ); )
    stbIF7( output7[0] += ( r * c7s ); )
    #else
    stbIF0( output0[0]  = ( r * c0s ); )
    stbIF1( output1[0]  = ( r * c1s ); )
    stbIF2( output2[0]  = ( r * c2s ); )
    stbIF3( output3[0]  = ( r * c3s ); )
    stbIF4( output4[0]  = ( r * c4s ); )
    stbIF5( output5[0]  = ( r * c5s ); )
    stbIF6( output6[0]  = ( r * c6s ); )
    stbIF7( output7[0]  = ( r * c7s ); )
    #endif

    ++input;
    stbIF0( ++output0; ) stbIF1( ++output1; ) stbIF2( ++output2; ) stbIF3( ++output3; ) stbIF4( ++output4; ) stbIF5( ++output5; ) stbIF6( ++output6; ) stbIF7( ++output7; )
  }
}